

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

ByteData * __thiscall cfd::core::Psbt::GetData(ByteData *__return_storage_ptr__,Psbt *this)

{
  wally_psbt *psbt;
  uint32_t uVar1;
  CfdException *this_00;
  int ret;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  int local_64;
  undefined8 local_60;
  undefined1 local_58 [32];
  uint8_t *local_38;
  long local_30;
  
  psbt = (wally_psbt *)this->wally_psbt_pointer_;
  local_60 = 0;
  if ((psbt == (wally_psbt *)0x0) || (psbt->num_inputs != 0)) {
    uVar1 = GetDataSize(this);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,(ulong)uVar1,
               (allocator_type *)local_58);
    local_64 = wally_psbt_to_bytes(psbt,0,local_38,local_30 - (long)local_38,&local_60);
    if (local_64 != 0) {
      local_58._0_8_ = "cfdcore_psbt.cpp";
      local_58._8_4_ = 0x7e4;
      local_58._16_8_ = "GetData";
      logger::log<int&>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,
                        "wally_psbt_to_bytes NG[{}]",&local_64);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_58._0_8_ = local_58 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"psbt to bytes error.","");
      CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_58);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData(__return_storage_ptr__,local_38,(uint32_t)local_60);
    if (local_38 != (uint8_t *)0x0) {
      operator_delete(local_38);
    }
  }
  else {
    CreatePsbtOutputOnlyData(__return_storage_ptr__,psbt);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::GetData() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  size_t size = 0;

  if ((psbt_pointer != nullptr) && (psbt_pointer->num_inputs == 0)) {
    return CreatePsbtOutputOnlyData(psbt_pointer);
  }

  std::vector<uint8_t> bytes(GetDataSize());
  int ret =
      wally_psbt_to_bytes(psbt_pointer, 0, bytes.data(), bytes.size(), &size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_to_bytes NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt to bytes error.");
  }
  return ByteData(bytes.data(), static_cast<uint32_t>(size));
}